

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_compute_compact_branch
               (DisasContext_conflict6 *ctx,uint32_t opc,int rs,int rt,int32_t offset)

{
  byte *pbVar1;
  TCGContext_conflict6 *s;
  TCGContext_conflict6 *pTVar2;
  uint uVar3;
  TCGTemp *pTVar4;
  TCGTemp *pTVar5;
  target_ulong tVar6;
  target_ulong tVar7;
  TCGLabel *l;
  TCGTemp *a2;
  TCGTemp *a3;
  TCGTemp *a3_00;
  TCGTemp *a1;
  TCGv_i64 arg;
  TCGv_i64 pTVar8;
  TCGv_i64 a2_00;
  uint uVar9;
  uintptr_t o_11;
  TCGOpcode TVar10;
  TCGCond TVar11;
  target_ulong tVar12;
  TCGv_i64 arg_00;
  uintptr_t o_3;
  TCGv_i64 pTVar13;
  uintptr_t o_14;
  uintptr_t o_2;
  TCGv_i64 ret;
  
  s = ctx->uc->tcg_ctx;
  pTVar4 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  arg_00 = (TCGv_i64)((long)pTVar4 - (long)s);
  pTVar5 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  arg = (TCGv_i64)((long)pTVar5 - (long)s);
  uVar3 = ctx->hflags;
  if ((uVar3 & 0x87f800) != 0) {
    generate_exception_err(ctx,0x14,0);
    goto LAB_0099cbb6;
  }
  uVar9 = uVar3 >> 10 & 1;
  if ((int)opc < 0x1c000000) {
    if ((int)opc < -0x18000000) {
      if (opc != 0xc8000000) {
        if (opc == 0xd8000000) goto LAB_0099c223;
        goto switchD_0099cadd_default;
      }
LAB_0099c2de:
      tVar7 = (ctx->base).pc_next + (long)offset + 4;
      tVar6 = (long)(int)tVar7;
      if ((uVar3 >> 9 & 1) == 0) {
        tVar6 = tVar7;
      }
      ctx->btarget = tVar6;
    }
    else {
      if (opc == 0xe8000000) goto LAB_0099c2de;
      if (opc != 0xf8000000) {
        if (opc == 0x18000000) goto LAB_0099c309;
        goto switchD_0099cadd_default;
      }
LAB_0099c223:
      if (rs != 0) {
        if (s->cpu_gpr[rs] != arg_00) {
          tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)pTVar4,(TCGArg)(s->cpu_gpr[rs] + (long)s))
          ;
          uVar3 = ctx->hflags;
        }
        tVar7 = (ctx->base).pc_next + (long)offset + 4;
        tVar6 = (long)(int)tVar7;
        if ((uVar3 >> 9 & 1) == 0) {
          tVar6 = tVar7;
        }
        ctx->btarget = tVar6;
        goto LAB_0099c405;
      }
      pTVar4 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
      pTVar8 = (TCGv_i64)((long)pTVar4 - (long)s);
      pTVar5 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
      if (rt == 0) {
        tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar4,0);
      }
      else if (s->cpu_gpr[rt] != pTVar8) {
        tcg_gen_op2_mips64el
                  (s,INDEX_op_mov_i64,(TCGArg)pTVar4,
                   (TCGArg)((long)&s->pool_cur + (long)s->cpu_gpr[rt]));
      }
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar5,(long)offset);
      pTVar13 = s->btarget;
      pTVar2 = ctx->uc->tcg_ctx;
      tcg_gen_op3_mips64el
                (pTVar2,INDEX_op_add_i64,(TCGArg)(pTVar13 + (long)&pTVar2->pool_cur),
                 (TCGArg)((long)pTVar2 + (long)pTVar8),(long)pTVar2 + ((long)pTVar5 - (long)s));
      if ((ctx->hflags & 0x200) != 0) {
        tcg_gen_ext32s_i64_mips64el(pTVar2,pTVar13,pTVar13);
      }
      tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar8 + (long)s));
      tcg_temp_free_internal_mips64el(s,(TCGTemp *)(((long)pTVar5 - (long)s) + (long)s));
    }
    uVar3 = 0x2000;
    switch((opc + 0x38000000) * 0x10 | opc + 0x38000000 >> 0x1c) {
    case 1:
      break;
    case 2:
      tcg_gen_op2_mips64el
                (s,INDEX_op_movi_i64,(TCGArg)(s->cpu_gpr[0x1f] + (long)s),
                 (ulong)(uVar9 | 4) + (ctx->base).pc_next);
    case 0:
      uVar3 = 0x800;
      break;
    case 3:
      tcg_gen_op2_mips64el
                (s,INDEX_op_movi_i64,(TCGArg)(s->cpu_gpr[0x1f] + (long)s),
                 (ulong)(uVar9 | 4) + (ctx->base).pc_next);
      break;
    default:
      goto switchD_0099cadd_default;
    }
    ctx->hflags = ctx->hflags | uVar3;
    gen_branch(ctx,4);
  }
  else {
    if ((int)opc < 0x58000000) {
      if (opc == 0x1c000000) {
LAB_0099c309:
        if ((rs != rt && rs != 0) ||
           (tcg_gen_op2_mips64el
                      (s,INDEX_op_movi_i64,(TCGArg)(s->cpu_gpr[0x1f] + (long)s),
                       (ulong)(uVar9 | 4) + (ctx->base).pc_next), rs != 0)) goto LAB_0099c365;
LAB_0099c38d:
        tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar4,0);
        goto LAB_0099c3a5;
      }
      if (opc == 0x20000000) goto LAB_0099c2a3;
      goto switchD_0099cadd_default;
    }
    if ((opc == 0x58000000) || (opc == 0x5c000000)) {
      if (rs == 0) goto LAB_0099c38d;
LAB_0099c365:
      if (s->cpu_gpr[rs] != arg_00) {
        tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)pTVar4,(TCGArg)(s->cpu_gpr[rs] + (long)s));
      }
LAB_0099c3a5:
      if (rt == 0) {
        TVar10 = INDEX_op_movi_i64;
        pTVar8 = (TCGv_i64)0x0;
LAB_0099c3dc:
        tcg_gen_op2_mips64el(s,TVar10,(TCGArg)pTVar5,(TCGArg)pTVar8);
      }
      else if (s->cpu_gpr[rt] != arg) {
        pTVar8 = s->cpu_gpr[rt] + (long)s;
        TVar10 = INDEX_op_mov_i64;
        goto LAB_0099c3dc;
      }
      tVar7 = (ctx->base).pc_next + (long)offset + 4;
      tVar6 = (long)(int)tVar7;
      if ((ctx->hflags >> 9 & 1) == 0) {
        tVar6 = tVar7;
      }
      ctx->btarget = tVar6;
    }
    else {
      if (opc != 0x60000000) goto switchD_0099cadd_default;
LAB_0099c2a3:
      if (rs == 0) {
        TVar10 = INDEX_op_movi_i64;
        pTVar8 = (TCGv_i64)0x0;
LAB_0099c700:
        tcg_gen_op2_mips64el(s,TVar10,(TCGArg)pTVar4,(TCGArg)pTVar8);
      }
      else if (s->cpu_gpr[rs] != arg_00) {
        pTVar8 = s->cpu_gpr[rs] + (long)s;
        TVar10 = INDEX_op_mov_i64;
        goto LAB_0099c700;
      }
      if (rt == 0) {
        TVar10 = INDEX_op_movi_i64;
        pTVar8 = (TCGv_i64)0x0;
LAB_0099c742:
        tcg_gen_op2_mips64el(s,TVar10,(TCGArg)pTVar5,(TCGArg)pTVar8);
      }
      else if (s->cpu_gpr[rt] != arg) {
        pTVar8 = s->cpu_gpr[rt] + (long)s;
        TVar10 = INDEX_op_mov_i64;
        goto LAB_0099c742;
      }
      tVar7 = (ctx->base).pc_next;
      tVar6 = tVar7 + 4 + (long)offset;
      tVar12 = (long)(int)tVar6;
      if ((ctx->hflags >> 9 & 1) == 0) {
        tVar12 = tVar6;
      }
      ctx->btarget = tVar12;
      if (-1 < rt && rs == 0) {
        tcg_gen_op2_mips64el
                  (s,INDEX_op_movi_i64,(TCGArg)(s->cpu_gpr[0x1f] + (long)s),tVar7 + 4 + (ulong)uVar9
                  );
      }
    }
LAB_0099c405:
    l = gen_new_label_mips64el(s);
    if (ctx->hflags != ctx->saved_hflags) {
      pTVar2 = ctx->uc->tcg_ctx;
      tcg_gen_op2_mips64el
                (pTVar2,INDEX_op_movi_i32,(TCGArg)(pTVar2->hflags + (long)pTVar2),
                 (long)(int)ctx->hflags);
      ctx->saved_hflags = ctx->hflags;
      uVar3 = ctx->hflags & 0x803800;
      if (((uVar3 == 0x800) || (uVar3 == 0x1800)) || (uVar3 == 0x1000)) {
        tcg_gen_op2_mips64el
                  (pTVar2,INDEX_op_movi_i64,(TCGArg)(pTVar2->btarget + (long)pTVar2),ctx->btarget);
      }
    }
    pTVar8 = arg;
    if ((int)opc < 0x20000000) {
      if ((int)opc < 0x18000000) {
        pTVar8 = arg_00;
        if (opc == 0xd8000000) {
          TVar11 = TCG_COND_NE;
        }
        else {
          if (opc != 0xf8000000) goto switchD_0099cadd_default;
          TVar11 = TCG_COND_EQ;
        }
LAB_0099c5ec:
        tcg_gen_brcondi_i64_mips64el(s,TVar11,pTVar8,0,l);
      }
      else {
        if (opc == 0x18000000) {
          if (rt == 0 || rs != 0) {
            if (((rt == 0) || (rs == 0)) || (rs != rt)) {
              TVar11 = TCG_COND_LTU;
              goto LAB_0099cb81;
            }
LAB_0099c7c1:
            TVar11 = TCG_COND_LT;
          }
          else {
LAB_0099c5bc:
            TVar11 = TCG_COND_GT;
          }
          goto LAB_0099c5ec;
        }
        if (opc != 0x1c000000) goto switchD_0099cadd_default;
        if (rt != 0 && rs == 0) goto LAB_0099c5d8;
        if (((rt != 0) && (rs != 0)) && (rs == rt)) goto LAB_0099c7e8;
        TVar11 = TCG_COND_GEU;
LAB_0099cb81:
        tcg_gen_brcond_i64_mips64el(s,TVar11,arg_00,arg,l);
      }
LAB_0099cb89:
      gen_goto_tb(ctx,1,ctx->btarget);
      *(byte *)l = *(byte *)l | 1;
      tcg_gen_op1_mips64el(s,INDEX_op_set_label,(TCGArg)l);
      pbVar1 = (byte *)((long)&ctx->hflags + 2);
      *pbVar1 = *pbVar1 | 0x80;
      goto LAB_0099cbb6;
    }
    if ((int)opc < 0x5c000000) {
      if (opc == 0x20000000) {
LAB_0099c579:
        if (rs < rt) {
          if (rs != 0) {
            if (opc == 0x20000000) {
              TVar11 = TCG_COND_NE;
            }
            else {
              TVar11 = TCG_COND_EQ;
            }
            goto LAB_0099cb81;
          }
          if (opc == 0x20000000) {
            TVar11 = TCG_COND_NE;
          }
          else {
            TVar11 = TCG_COND_EQ;
          }
          goto LAB_0099c5ec;
        }
        a2 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
        a3 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
        a3_00 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
        a1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
        if (rs == 0) {
          TVar10 = INDEX_op_movi_i64;
          pTVar8 = (TCGv_i64)0x0;
LAB_0099c820:
          tcg_gen_op2_mips64el(s,TVar10,(TCGArg)pTVar4,(TCGArg)pTVar8);
        }
        else if (s->cpu_gpr[rs] != arg_00) {
          pTVar8 = s->cpu_gpr[rs] + (long)s;
          TVar10 = INDEX_op_mov_i64;
          goto LAB_0099c820;
        }
        ret = (TCGv_i64)((long)a2 - (long)s);
        pTVar13 = (TCGv_i64)((long)a3 - (long)s);
        pTVar8 = (TCGv_i64)((long)a3_00 - (long)s);
        if (rt == 0) {
          TVar10 = INDEX_op_movi_i64;
          a2_00 = (TCGv_i64)0x0;
LAB_0099c884:
          tcg_gen_op2_mips64el(s,TVar10,(TCGArg)pTVar5,(TCGArg)a2_00);
        }
        else if (s->cpu_gpr[rt] != arg) {
          a2_00 = s->cpu_gpr[rt] + (long)s;
          TVar10 = INDEX_op_mov_i64;
          goto LAB_0099c884;
        }
        tcg_gen_ext32s_i64_mips64el(s,ret,arg_00);
        tcg_gen_setcond_i64_mips64el(s,TCG_COND_NE,(TCGv_i64)((long)a1 - (long)s),ret,arg_00);
        tcg_gen_ext32s_i64_mips64el(s,pTVar13,arg);
        tcg_gen_setcond_i64_mips64el(s,TCG_COND_NE,pTVar8,pTVar13,arg);
        tcg_gen_op3_mips64el(s,INDEX_op_or_i64,(TCGArg)a1,(TCGArg)a1,(TCGArg)a3_00);
        tcg_gen_op3_mips64el(s,INDEX_op_add_i64,(TCGArg)a3_00,(TCGArg)a2,(TCGArg)a3);
        tcg_gen_ext32s_i64_mips64el(s,pTVar8,pTVar8);
        tcg_gen_op3_mips64el(s,INDEX_op_xor_i64,(TCGArg)a2,(TCGArg)a2,(TCGArg)a3);
        tcg_gen_op3_mips64el(s,INDEX_op_xor_i64,(TCGArg)a3,(TCGArg)a3_00,(TCGArg)a3);
        tcg_gen_andc_i64_mips64el(s,ret,pTVar13,ret);
        tcg_gen_setcondi_i64_mips64el(s,TCG_COND_LT,pTVar8,ret,0);
        tcg_gen_op3_mips64el(s,INDEX_op_or_i64,(TCGArg)a3_00,(TCGArg)a3_00,(TCGArg)a1);
        tcg_gen_brcondi_i64_mips64el(s,opc == 0x20000000 ^ TCG_COND_NE,pTVar8,0,l);
        tcg_temp_free_internal_mips64el(s,(TCGTemp *)((TCGv_i64)((long)a1 - (long)s) + (long)s));
        tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar8 + (long)s));
        tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar13 + (long)s));
        tcg_temp_free_internal_mips64el(s,(TCGTemp *)(ret + (long)s));
        goto LAB_0099cb89;
      }
      if (opc == 0x58000000) {
        if (rt != 0 && rs == 0) goto LAB_0099c5bc;
        if (((rt != 0) && (rs != 0)) && (rs == rt)) goto LAB_0099c7c1;
        TVar11 = TCG_COND_LT;
        goto LAB_0099cb81;
      }
    }
    else {
      if (opc == 0x5c000000) {
        if (rt == 0 || rs != 0) {
          if (((rt == 0) || (rs == 0)) || (rs != rt)) {
            TVar11 = TCG_COND_GE;
            goto LAB_0099cb81;
          }
LAB_0099c7e8:
          TVar11 = TCG_COND_GE;
        }
        else {
LAB_0099c5d8:
          TVar11 = TCG_COND_LE;
        }
        goto LAB_0099c5ec;
      }
      if (opc == 0x60000000) goto LAB_0099c579;
    }
switchD_0099cadd_default:
    generate_exception_err(ctx,0x14,0);
  }
LAB_0099cbb6:
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(arg_00 + (long)s));
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(arg + (long)s));
  return;
}

Assistant:

static void gen_compute_compact_branch(DisasContext *ctx, uint32_t opc,
                                       int rs, int rt, int32_t offset)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int bcond_compute = 0;
    TCGv t0 = tcg_temp_new(tcg_ctx);
    TCGv t1 = tcg_temp_new(tcg_ctx);
    int m16_lowbit = (ctx->hflags & MIPS_HFLAG_M16) != 0;

    if (ctx->hflags & MIPS_HFLAG_BMASK) {
#ifdef MIPS_DEBUG_DISAS
        LOG_DISAS("Branch in delay / forbidden slot at PC 0x" TARGET_FMT_lx
                  "\n", ctx->base.pc_next);
#endif
        generate_exception_end(ctx, EXCP_RI);
        goto out;
    }

    /* Load needed operands and calculate btarget */
    switch (opc) {
    /* compact branch */
    case OPC_BOVC: /* OPC_BEQZALC, OPC_BEQC */
    case OPC_BNVC: /* OPC_BNEZALC, OPC_BNEC */
        gen_load_gpr(tcg_ctx, t0, rs);
        gen_load_gpr(tcg_ctx, t1, rt);
        bcond_compute = 1;
        ctx->btarget = addr_add(ctx, ctx->base.pc_next + 4, offset);
        if (rs <= rt && rs == 0) {
            /* OPC_BEQZALC, OPC_BNEZALC */
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[31], ctx->base.pc_next + 4 + m16_lowbit);
        }
        break;
    case OPC_BLEZC: /* OPC_BGEZC, OPC_BGEC */
    case OPC_BGTZC: /* OPC_BLTZC, OPC_BLTC */
        gen_load_gpr(tcg_ctx, t0, rs);
        gen_load_gpr(tcg_ctx, t1, rt);
        bcond_compute = 1;
        ctx->btarget = addr_add(ctx, ctx->base.pc_next + 4, offset);
        break;
    case OPC_BLEZALC: /* OPC_BGEZALC, OPC_BGEUC */
    case OPC_BGTZALC: /* OPC_BLTZALC, OPC_BLTUC */
        if (rs == 0 || rs == rt) {
            /* OPC_BLEZALC, OPC_BGEZALC */
            /* OPC_BGTZALC, OPC_BLTZALC */
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[31], ctx->base.pc_next + 4 + m16_lowbit);
        }
        gen_load_gpr(tcg_ctx, t0, rs);
        gen_load_gpr(tcg_ctx, t1, rt);
        bcond_compute = 1;
        ctx->btarget = addr_add(ctx, ctx->base.pc_next + 4, offset);
        break;
    case OPC_BC:
    case OPC_BALC:
        ctx->btarget = addr_add(ctx, ctx->base.pc_next + 4, offset);
        break;
    case OPC_BEQZC:
    case OPC_BNEZC:
        if (rs != 0) {
            /* OPC_BEQZC, OPC_BNEZC */
            gen_load_gpr(tcg_ctx, t0, rs);
            bcond_compute = 1;
            ctx->btarget = addr_add(ctx, ctx->base.pc_next + 4, offset);
        } else {
            /* OPC_JIC, OPC_JIALC */
            TCGv tbase = tcg_temp_new(tcg_ctx);
            TCGv toffset = tcg_temp_new(tcg_ctx);

            gen_load_gpr(tcg_ctx, tbase, rt);
            tcg_gen_movi_tl(tcg_ctx, toffset, offset);
            gen_op_addr_add(ctx, tcg_ctx->btarget, tbase, toffset);
            tcg_temp_free(tcg_ctx, tbase);
            tcg_temp_free(tcg_ctx, toffset);
        }
        break;
    default:
        MIPS_INVAL("Compact branch/jump");
        generate_exception_end(ctx, EXCP_RI);
        goto out;
    }

    if (bcond_compute == 0) {
        /* Uncoditional compact branch */
        switch (opc) {
        case OPC_JIALC:
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[31], ctx->base.pc_next + 4 + m16_lowbit);
            /* Fallthrough */
        case OPC_JIC:
            ctx->hflags |= MIPS_HFLAG_BR;
            break;
        case OPC_BALC:
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[31], ctx->base.pc_next + 4 + m16_lowbit);
            /* Fallthrough */
        case OPC_BC:
            ctx->hflags |= MIPS_HFLAG_B;
            break;
        default:
            MIPS_INVAL("Compact branch/jump");
            generate_exception_end(ctx, EXCP_RI);
            goto out;
        }

        /* Generating branch here as compact branches don't have delay slot */
        gen_branch(ctx, 4);
    } else {
        /* Conditional compact branch */
        TCGLabel *fs = gen_new_label(tcg_ctx);
        save_cpu_state(ctx, 0);

        switch (opc) {
        case OPC_BLEZALC: /* OPC_BGEZALC, OPC_BGEUC */
            if (rs == 0 && rt != 0) {
                /* OPC_BLEZALC */
                tcg_gen_brcondi_tl(tcg_ctx, tcg_invert_cond(TCG_COND_LE), t1, 0, fs);
            } else if (rs != 0 && rt != 0 && rs == rt) {
                /* OPC_BGEZALC */
                tcg_gen_brcondi_tl(tcg_ctx, tcg_invert_cond(TCG_COND_GE), t1, 0, fs);
            } else {
                /* OPC_BGEUC */
                tcg_gen_brcond_tl(tcg_ctx, tcg_invert_cond(TCG_COND_GEU), t0, t1, fs);
            }
            break;
        case OPC_BGTZALC: /* OPC_BLTZALC, OPC_BLTUC */
            if (rs == 0 && rt != 0) {
                /* OPC_BGTZALC */
                tcg_gen_brcondi_tl(tcg_ctx, tcg_invert_cond(TCG_COND_GT), t1, 0, fs);
            } else if (rs != 0 && rt != 0 && rs == rt) {
                /* OPC_BLTZALC */
                tcg_gen_brcondi_tl(tcg_ctx, tcg_invert_cond(TCG_COND_LT), t1, 0, fs);
            } else {
                /* OPC_BLTUC */
                tcg_gen_brcond_tl(tcg_ctx, tcg_invert_cond(TCG_COND_LTU), t0, t1, fs);
            }
            break;
        case OPC_BLEZC: /* OPC_BGEZC, OPC_BGEC */
            if (rs == 0 && rt != 0) {
                /* OPC_BLEZC */
                tcg_gen_brcondi_tl(tcg_ctx, tcg_invert_cond(TCG_COND_LE), t1, 0, fs);
            } else if (rs != 0 && rt != 0 && rs == rt) {
                /* OPC_BGEZC */
                tcg_gen_brcondi_tl(tcg_ctx, tcg_invert_cond(TCG_COND_GE), t1, 0, fs);
            } else {
                /* OPC_BGEC */
                tcg_gen_brcond_tl(tcg_ctx, tcg_invert_cond(TCG_COND_GE), t0, t1, fs);
            }
            break;
        case OPC_BGTZC: /* OPC_BLTZC, OPC_BLTC */
            if (rs == 0 && rt != 0) {
                /* OPC_BGTZC */
                tcg_gen_brcondi_tl(tcg_ctx, tcg_invert_cond(TCG_COND_GT), t1, 0, fs);
            } else if (rs != 0 && rt != 0 && rs == rt) {
                /* OPC_BLTZC */
                tcg_gen_brcondi_tl(tcg_ctx, tcg_invert_cond(TCG_COND_LT), t1, 0, fs);
            } else {
                /* OPC_BLTC */
                tcg_gen_brcond_tl(tcg_ctx, tcg_invert_cond(TCG_COND_LT), t0, t1, fs);
            }
            break;
        case OPC_BOVC: /* OPC_BEQZALC, OPC_BEQC */
        case OPC_BNVC: /* OPC_BNEZALC, OPC_BNEC */
            if (rs >= rt) {
                /* OPC_BOVC, OPC_BNVC */
                TCGv t2 = tcg_temp_new(tcg_ctx);
                TCGv t3 = tcg_temp_new(tcg_ctx);
                TCGv t4 = tcg_temp_new(tcg_ctx);
                TCGv input_overflow = tcg_temp_new(tcg_ctx);

                gen_load_gpr(tcg_ctx, t0, rs);
                gen_load_gpr(tcg_ctx, t1, rt);
                tcg_gen_ext32s_tl(tcg_ctx, t2, t0);
                tcg_gen_setcond_tl(tcg_ctx, TCG_COND_NE, input_overflow, t2, t0);
                tcg_gen_ext32s_tl(tcg_ctx, t3, t1);
                tcg_gen_setcond_tl(tcg_ctx, TCG_COND_NE, t4, t3, t1);
                tcg_gen_or_tl(tcg_ctx, input_overflow, input_overflow, t4);

                tcg_gen_add_tl(tcg_ctx, t4, t2, t3);
                tcg_gen_ext32s_tl(tcg_ctx, t4, t4);
                tcg_gen_xor_tl(tcg_ctx, t2, t2, t3);
                tcg_gen_xor_tl(tcg_ctx, t3, t4, t3);
                tcg_gen_andc_tl(tcg_ctx, t2, t3, t2);
                tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_LT, t4, t2, 0);
                tcg_gen_or_tl(tcg_ctx, t4, t4, input_overflow);
                if (opc == OPC_BOVC) {
                    /* OPC_BOVC */
                    tcg_gen_brcondi_tl(tcg_ctx, tcg_invert_cond(TCG_COND_NE), t4, 0, fs);
                } else {
                    /* OPC_BNVC */
                    tcg_gen_brcondi_tl(tcg_ctx, tcg_invert_cond(TCG_COND_EQ), t4, 0, fs);
                }
                tcg_temp_free(tcg_ctx, input_overflow);
                tcg_temp_free(tcg_ctx, t4);
                tcg_temp_free(tcg_ctx, t3);
                tcg_temp_free(tcg_ctx, t2);
            } else if (rs < rt && rs == 0) {
                /* OPC_BEQZALC, OPC_BNEZALC */
                if (opc == OPC_BEQZALC) {
                    /* OPC_BEQZALC */
                    tcg_gen_brcondi_tl(tcg_ctx, tcg_invert_cond(TCG_COND_EQ), t1, 0, fs);
                } else {
                    /* OPC_BNEZALC */
                    tcg_gen_brcondi_tl(tcg_ctx, tcg_invert_cond(TCG_COND_NE), t1, 0, fs);
                }
            } else {
                /* OPC_BEQC, OPC_BNEC */
                if (opc == OPC_BEQC) {
                    /* OPC_BEQC */
                    tcg_gen_brcond_tl(tcg_ctx, tcg_invert_cond(TCG_COND_EQ), t0, t1, fs);
                } else {
                    /* OPC_BNEC */
                    tcg_gen_brcond_tl(tcg_ctx, tcg_invert_cond(TCG_COND_NE), t0, t1, fs);
                }
            }
            break;
        case OPC_BEQZC:
            tcg_gen_brcondi_tl(tcg_ctx, tcg_invert_cond(TCG_COND_EQ), t0, 0, fs);
            break;
        case OPC_BNEZC:
            tcg_gen_brcondi_tl(tcg_ctx, tcg_invert_cond(TCG_COND_NE), t0, 0, fs);
            break;
        default:
            MIPS_INVAL("Compact conditional branch/jump");
            generate_exception_end(ctx, EXCP_RI);
            goto out;
        }

        /* Generating branch here as compact branches don't have delay slot */
        gen_goto_tb(ctx, 1, ctx->btarget);
        gen_set_label(tcg_ctx, fs);

        ctx->hflags |= MIPS_HFLAG_FBNSLOT;
    }

out:
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
}